

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

thousands_sep_result<wchar_t> *
fmt::v10::detail::thousands_sep_impl<wchar_t>
          (thousands_sep_result<wchar_t> *__return_storage_ptr__,locale_ref loc)

{
  numpunct *pnVar1;
  ulong uVar2;
  wchar_t local_84;
  string local_58 [4];
  wchar_t thousands_sep;
  string grouping;
  locale local_28 [8];
  numpunct *local_20;
  numpunct<wchar_t> *facet;
  locale_ref loc_local;
  
  facet = (numpunct<wchar_t> *)loc.locale_;
  loc_local.locale_ = __return_storage_ptr__;
  locale_ref::get<std::locale>((locale_ref *)local_28);
  pnVar1 = std::use_facet<std::__cxx11::numpunct<wchar_t>>(local_28);
  std::locale::~locale(local_28);
  local_20 = pnVar1;
  std::__cxx11::numpunct<wchar_t>::grouping();
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    local_84 = std::__cxx11::numpunct<wchar_t>::thousands_sep();
  }
  else {
    local_84 = L'\0';
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,local_58);
  __return_storage_ptr__->thousands_sep = local_84;
  std::__cxx11::string::~string(local_58);
  return __return_storage_ptr__;
}

Assistant:

FMT_FUNC auto thousands_sep_impl(locale_ref loc) -> thousands_sep_result<Char> {
  auto& facet = std::use_facet<std::numpunct<Char>>(loc.get<std::locale>());
  auto grouping = facet.grouping();
  auto thousands_sep = grouping.empty() ? Char() : facet.thousands_sep();
  return {std::move(grouping), thousands_sep};
}